

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_set_options.c
# Opt level: O3

int archive_set_filter_option(archive *_a,char *m,char *o,char *v)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  sVar3 = _a[1].error_string.buffer_length;
  if (sVar3 == 0) {
    iVar2 = -0x14;
  }
  else {
    iVar2 = -0x14;
    do {
      UNRECOVERED_JUMPTABLE = *(code **)(sVar3 + 0x18);
      if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
        if (m == (char *)0x0) {
          iVar1 = (*UNRECOVERED_JUMPTABLE)(sVar3,o,v);
          if (iVar1 == -0x1e) {
            return -0x1e;
          }
          if (iVar1 == 0) {
            iVar2 = 0;
          }
        }
        else {
          iVar1 = strcmp(*(char **)(sVar3 + 0x48),m);
          if (iVar1 == 0) {
            iVar2 = (*UNRECOVERED_JUMPTABLE)(sVar3,o,v);
            return iVar2;
          }
        }
      }
      sVar3 = *(size_t *)(sVar3 + 0x10);
    } while (sVar3 != 0);
  }
  iVar1 = -0x15;
  if (iVar2 != -0x14) {
    iVar1 = iVar2;
  }
  if (m == (char *)0x0) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

static int
archive_set_filter_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter;
	struct archive_read_filter_bidder *bidder;
	int r, rv = ARCHIVE_WARN, matched_modules = 0;

	for (filter = a->filter; filter != NULL; filter = filter->upstream) {
		bidder = filter->bidder;
		if (bidder == NULL)
			continue;
		if (bidder->options == NULL)
			/* This bidder does not support option */
			continue;
		if (m != NULL) {
			if (strcmp(filter->name, m) != 0)
				continue;
			++matched_modules;
		}

		r = bidder->options(bidder, o, v);

		if (r == ARCHIVE_FATAL)
			return (ARCHIVE_FATAL);

		if (r == ARCHIVE_OK)
			rv = ARCHIVE_OK;
	}
	/* If the filter name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (m != NULL && matched_modules == 0)
		return ARCHIVE_WARN - 1;
	return (rv);
}